

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  ushort *puVar1;
  u32 uVar2;
  u8 *puVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar5 = (ulong)pPg->hdrOffset;
  puVar3 = pPg->aData;
  uVar8 = uVar5 + 1;
  uVar2 = pPg->pBt->usableSize;
  uVar9 = uVar2 - nByte;
  uVar10 = (uint)(ushort)(*(ushort *)(puVar3 + uVar5 + 1) << 8 |
                         *(ushort *)(puVar3 + uVar5 + 1) >> 8);
  while( true ) {
    if ((int)uVar9 < (int)uVar10) {
      if ((int)uVar10 <= (int)(uVar2 - 4)) {
        return (u8 *)0x0;
      }
      uVar6 = 0x1107e;
      goto LAB_00167dae;
    }
    puVar1 = (ushort *)(puVar3 + uVar10);
    uVar11 = (uint)(ushort)(*(ushort *)(puVar3 + (ulong)uVar10 + 2) << 8 |
                           *(ushort *)(puVar3 + (ulong)uVar10 + 2) >> 8) - nByte;
    if (-1 < (int)uVar11) break;
    uVar7 = *puVar1 << 8 | *puVar1 >> 8;
    uVar8 = (ulong)uVar10;
    bVar4 = uVar7 <= uVar10;
    uVar10 = (uint)uVar7;
    if (bVar4) {
      if (uVar7 != 0) {
        uVar6 = 0x11077;
LAB_00167dae:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar6,
                    "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
        *pRc = 0xb;
      }
      return (u8 *)0x0;
    }
  }
  if (uVar11 < 4) {
    if (0x39 < puVar3[uVar5 + 7]) {
      return (u8 *)0x0;
    }
    *(ushort *)(puVar3 + uVar8) = *puVar1;
    puVar3[uVar5 + 7] = puVar3[uVar5 + 7] + (char)uVar11;
    return (u8 *)puVar1;
  }
  if (uVar10 + uVar11 <= uVar9) {
    puVar1[1] = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
    return puVar3 + (uVar10 + uVar11);
  }
  uVar6 = 0x11068;
  goto LAB_00167dae;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  u8 *pTmp = &aData[iAddr];                  /* Temporary ptr into aData[] */
  int pc = get2byte(pTmp);                   /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    pTmp = &aData[pc+2];
    size = get2byte(pTmp);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
        return &aData[pc];
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pTmp = &aData[pc];
    pc = get2byte(pTmp);
    if( pc<=iAddr ){
      if( pc ){
        /* The next slot in the chain comes before the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}